

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

bool Js::JavascriptArray::CopyNativeFloatArrayElements
               (JavascriptNativeFloatArray *dstArray,uint32 dstIndex,
               JavascriptNativeFloatArray *srcArray,uint32 start,uint32 end)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  uint32 count;
  double newValue;
  undefined1 local_60 [8];
  ArrayElementEnumerator e;
  
  uVar1 = (srcArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.length;
  if (uVar1 < end) {
    end = uVar1;
  }
  if (start < end) {
    if (CARRY4(dstIndex,end - start)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2d2b,"(end - start <= MaxArrayLength - dstIndex)",
                                  "end - start <= MaxArrayLength - dstIndex");
      if (!bVar3) {
LAB_00a459a3:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      if ((srcArray->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.length <
          end) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2d2c,"(start < end && end <= srcArray->length)",
                                    "start < end && end <= srcArray->length");
        if (!bVar3) goto LAB_00a459a3;
        *puVar5 = 0;
      }
    }
    e._16_8_ = srcArray;
    ArrayElementEnumerator::ArrayElementEnumerator
              ((ArrayElementEnumerator *)local_60,(JavascriptArray *)srcArray,start,end);
    count = 0;
    while( true ) {
      bVar3 = ArrayElementEnumerator::MoveNext<double>((ArrayElementEnumerator *)local_60);
      if (!bVar3) break;
      uVar4 = ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)local_60);
      newValue = ArrayElementEnumerator::GetItem<double>((ArrayElementEnumerator *)local_60);
      DirectSetItemAt<double>((JavascriptArray *)dstArray,uVar4 + (dstIndex - start),newValue);
      count = count + 1;
    }
    bVar3 = end - start != count;
    if (bVar3) {
      JavascriptNativeFloatArray::ToVarArray(dstArray);
      InternalFillFromPrototype
                ((JavascriptArray *)dstArray,dstIndex,(JavascriptArray *)e._16_8_,start,end,count);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool JavascriptArray::CopyNativeFloatArrayElements(JavascriptNativeFloatArray* dstArray, uint32 dstIndex, JavascriptNativeFloatArray* srcArray, uint32 start, uint32 end)
    {
        end = min(end, srcArray->length);
        if (start >= end)
        {
            return false;
        }

        Assert(end - start <= MaxArrayLength - dstIndex);
        Assert(start < end && end <= srcArray->length);

        uint32 count = 0;

        // iterate on the array itself
        ArrayElementEnumerator e(srcArray, start, end);
        while(e.MoveNext<double>())
        {
            uint n = dstIndex + (e.GetIndex() - start);
            dstArray->DirectSetItemAt(n, e.GetItem<double>());
            count++;
        }

        // iterate on the array's prototypes only if not all elements found
        if (start + count != end)
        {
            JavascriptArray *varArray = JavascriptNativeFloatArray::ToVarArray(dstArray);
            InternalFillFromPrototype(varArray, dstIndex, srcArray, start, end, count);
            return true;
        }

        return false;
    }